

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

HeapArgumentsObject *
Js::JavascriptOperators::CreateHeapArguments
          (JavascriptFunction *funcCallee,uint32 actualsCount,uint32 formalsCount,Var frameObj,
          ScriptContext *scriptContext)

{
  JavascriptLibrary *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  HeapArgumentsObject *this_00;
  DynamicTypeHandler *pDVar4;
  Var newValue;
  JavascriptFunction *pJVar5;
  DynamicTypeHandler *pDVar6;
  undefined4 *puVar7;
  
  this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  BVar3 = JavascriptFunction::IsStrictMode(funcCallee);
  this_00 = JavascriptLibrary::CreateHeapArguments(this,frameObj,formalsCount,BVar3 != 0);
  pDVar4 = DynamicObject::GetTypeHandler((DynamicObject *)this_00);
  HeapArgumentsObject::SetNumberOfArguments(this_00,actualsCount);
  newValue = JavascriptNumber::ToVar(actualsCount,scriptContext);
  SetProperty(this_00,(RecyclableObject *)this_00,0xd1,newValue,scriptContext,PropertyOperation_None
             );
  pJVar5 = JavascriptLibrary::EnsureArrayPrototypeValuesFunction(this);
  SetProperty(this_00,(RecyclableObject *)this_00,0x14,pJVar5,scriptContext,PropertyOperation_None);
  BVar3 = JavascriptFunction::IsStrictMode(funcCallee);
  if (BVar3 == 0) {
    pJVar5 = StackScriptFunction::EnsureBoxed(funcCallee,(void *)0x0,L"callee");
    SetProperty(this_00,(RecyclableObject *)this_00,0x1ce,pJVar5,scriptContext,
                PropertyOperation_None);
  }
  else {
    pJVar5 = (this->super_JavascriptLibraryBase).throwTypeErrorRestrictedPropertyAccessorFunction.
             ptr;
    (*(this_00->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
              (this_00,0x1ce,pJVar5,pJVar5,0x40);
  }
  pDVar6 = DynamicObject::GetTypeHandler((DynamicObject *)this_00);
  if (pDVar6 != pDVar4) {
    bVar2 = ScriptContext::IsScriptContextInDebugMode(scriptContext);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1daa,
                                  "(argsObj->GetTypeHandler() == typeHandler || scriptContext->IsScriptContextInDebugMode())"
                                  ,
                                  "type handler should not transition because we initialized it correctly"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
  }
  return this_00;
}

Assistant:

HeapArgumentsObject *JavascriptOperators::CreateHeapArguments(JavascriptFunction *funcCallee, uint32 actualsCount, uint32 formalsCount, Var frameObj, ScriptContext* scriptContext)
    {
        JavascriptLibrary *library = scriptContext->GetLibrary();
        HeapArgumentsObject *argsObj = library->CreateHeapArguments(frameObj, formalsCount, !!funcCallee->IsStrictMode());

#if DBG
        DynamicTypeHandler* typeHandler = argsObj->GetTypeHandler();
#endif

        //
        // Set the number of arguments of Arguments Object
        //
        argsObj->SetNumberOfArguments(actualsCount);

        JavascriptOperators::SetProperty(argsObj, argsObj, PropertyIds::length, JavascriptNumber::ToVar(actualsCount, scriptContext), scriptContext);
        JavascriptOperators::SetProperty(argsObj, argsObj, PropertyIds::_symbolIterator, library->EnsureArrayPrototypeValuesFunction(), scriptContext);
        if (funcCallee->IsStrictMode())
        {
            JavascriptFunction* restrictedPropertyAccessor = library->GetThrowTypeErrorRestrictedPropertyAccessorFunction();
            argsObj->SetAccessors(PropertyIds::callee, restrictedPropertyAccessor, restrictedPropertyAccessor, PropertyOperation_NonFixedValue);

        }
        else
        {
            JavascriptOperators::SetProperty(argsObj, argsObj, PropertyIds::callee,
                StackScriptFunction::EnsureBoxed(BOX_PARAM(funcCallee, nullptr, _u("callee"))), scriptContext);
        }

        AssertMsg(argsObj->GetTypeHandler() == typeHandler || scriptContext->IsScriptContextInDebugMode(), "type handler should not transition because we initialized it correctly");

        return argsObj;
    }